

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::logMessage(Federate *this,int level,string_view message)

{
  element_type *peVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined8 uStack_8;
  
  peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*peVar1->_vptr_Core[0x53])(peVar1,(ulong)(uint)(this->fedID).fid);
    return;
  }
  uStack_8 = this;
  if (level < 4) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,message._M_str,message._M_len);
    pcVar3 = (char *)((long)&uStack_8 + 6);
  }
  else {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,message._M_str,message._M_len);
    pcVar3 = (char *)((long)&uStack_8 + 7);
  }
  *pcVar3 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,1);
  return;
}

Assistant:

void Federate::logMessage(int level, std::string_view message) const
{
    if (coreObject) {
        coreObject->logMessage(fedID, level, message);
    } else if (level <= HELICS_LOG_LEVEL_WARNING) {
        std::cerr << message << '\n';
    } else {
        std::cout << message << '\n';
    }
}